

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3VdbeExpandSql(Vdbe *p,char *zRawSql)

{
  uchar *puVar1;
  ushort uVar2;
  sqlite3 *psVar3;
  u8 uVar4;
  Vdbe *pVVar5;
  char cVar6;
  int nName;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  Mem *pMVar11;
  int nTotal;
  uint N;
  long lVar12;
  uchar *puVar13;
  int idx;
  int tokenType;
  Mem utf8;
  StrAccum local_b8;
  int local_8c;
  int local_88;
  int local_84;
  Vdbe *local_80;
  MemValue local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  sqlite3 *psStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_40;
  Mem *local_38;
  
  local_8c = 0;
  psVar3 = p->db;
  local_b8.mxAlloc = psVar3->aLimit[0];
  local_b8.nAlloc = 0;
  local_b8.db = (sqlite3 *)0x0;
  local_b8.zText = (char *)0x0;
  local_b8.nChar = 0;
  local_b8.accError = '\0';
  local_b8.printfFlags = '\0';
  if (psVar3->nVdbeExec < 2) {
    if (p->nVar == 0) {
      if (zRawSql == (char *)0x0) {
        N = 0;
      }
      else {
        sVar8 = strlen(zRawSql);
        N = (uint)sVar8 & 0x3fffffff;
      }
LAB_0013b69b:
      sqlite3_str_append(&local_b8,zRawSql,N);
    }
    else {
      local_80 = p;
      if (*zRawSql != '\0') {
        local_88 = 1;
        do {
          N = 0;
          puVar13 = (uchar *)zRawSql;
          while (nName = sqlite3GetToken(puVar13,&local_84), local_84 != 0x9c) {
            N = N + nName;
            puVar1 = puVar13 + nName;
            puVar13 = puVar13 + nName;
            if (*puVar1 == '\0') goto LAB_0013b69b;
          }
          sqlite3_str_append(&local_b8,zRawSql,N);
          pVVar5 = local_80;
          iVar7 = local_88;
          if (nName == 0) break;
          puVar13 = (uchar *)zRawSql + (int)N;
          if (*puVar13 == '?') {
            if (nName < 2) {
              local_8c = local_88;
              local_88 = iVar7;
            }
            else {
              sqlite3GetInt32((char *)(puVar13 + 1),&local_8c);
              local_88 = iVar7;
            }
          }
          else {
            local_8c = sqlite3VListNameToNum(local_80->pVList,(char *)puVar13,nName);
          }
          if (local_88 < local_8c + 1) {
            local_88 = local_8c + 1;
          }
          uVar2 = pVVar5->aVar[(long)local_8c + -1].flags;
          if ((uVar2 & 1) == 0) {
            pMVar11 = pVVar5->aVar + local_8c;
            if ((uVar2 & 0x24) == 0) {
              if ((uVar2 & 8) == 0) {
                if ((uVar2 & 2) == 0) {
                  if ((uVar2 >> 10 & 1) == 0) {
                    if (local_b8.nChar + 2 < local_b8.nAlloc) {
                      (local_b8.zText + local_b8.nChar)[0] = 'x';
                      (local_b8.zText + local_b8.nChar)[1] = '\'';
                      local_b8.nChar = local_b8.nChar + 2;
                    }
                    else {
                      enlargeAndAppend(&local_b8,"x\'",2);
                    }
                    if (0 < (long)pMVar11[-1].n) {
                      lVar12 = 0;
                      local_40 = (long)pMVar11[-1].n;
                      local_38 = pMVar11;
                      do {
                        sqlite3_str_appendf(&local_b8,"%02x",(ulong)(byte)local_38[-1].z[lVar12]);
                        lVar12 = lVar12 + 1;
                      } while (local_40 != lVar12);
                    }
                    if (local_b8.nAlloc <= local_b8.nChar + 1) {
                      pcVar9 = "\'";
                      iVar7 = 1;
                      goto LAB_0013b484;
                    }
                    local_b8.zText[local_b8.nChar] = '\'';
                    local_b8.nChar = local_b8.nChar + 1;
                  }
                  else {
                    sqlite3_str_appendf(&local_b8,"zeroblob(%d)",(ulong)(uint)pMVar11[-1].u.nZero);
                  }
                }
                else if (psVar3->enc == '\x01') {
                  sqlite3_str_appendf(&local_b8,"\'%.*q\'",(ulong)(uint)pMVar11[-1].n,pMVar11[-1].z)
                  ;
                }
                else {
                  local_68 = 0;
                  local_58 = 0;
                  uStack_50 = 0;
                  local_78.r = 0.0;
                  uStack_70 = 0;
                  local_48 = 0;
                  psStack_60 = psVar3;
                  sqlite3VdbeMemSetStr
                            ((Mem *)&local_78,pMVar11[-1].z,(long)pMVar11[-1].n,psVar3->enc,
                             (_func_void_void_ptr *)0x0);
                  if ((local_68 & 0x200000000) == 0) {
                    local_68._0_7_ = CONCAT16(1,(undefined6)local_68);
                  }
                  else if ((local_68._6_1_ != '\x01') &&
                          (iVar7 = sqlite3VdbeMemTranslate((Mem *)&local_78,'\x01'), iVar7 == 7)) {
                    local_b8.accError = 7;
                    local_b8.nAlloc = 0;
                  }
                  sqlite3_str_appendf(&local_b8,"\'%.*q\'",local_68 & 0xffffffff,uStack_70);
                  if (((local_68 & 0x900000000000) != 0) || ((int)local_58 != 0)) {
                    vdbeMemClear((Mem *)&local_78);
                  }
                }
              }
              else {
                sqlite3_str_appendf(&local_b8,"%!.15g",pMVar11[-1].u.nZero);
              }
            }
            else {
              sqlite3_str_appendf(&local_b8,"%lld",pMVar11[-1].u.r);
            }
          }
          else if (local_b8.nChar + 4 < local_b8.nAlloc) {
            builtin_strncpy(local_b8.zText + local_b8.nChar,"NULL",4);
            local_b8.nChar = local_b8.nChar + 4;
          }
          else {
            pcVar9 = "NULL";
            iVar7 = 4;
LAB_0013b484:
            enlargeAndAppend(&local_b8,pcVar9,iVar7);
          }
          zRawSql = (char *)(puVar13 + nName);
        } while (*zRawSql != '\0');
      }
    }
  }
  else {
    cVar6 = *zRawSql;
    while (cVar6 != '\0') {
      lVar12 = 1;
      do {
        lVar10 = lVar12;
        if (cVar6 == '\n') break;
        cVar6 = zRawSql[lVar10];
        lVar12 = lVar10 + 1;
      } while (cVar6 != '\0');
      if (local_b8.nChar + 3 < local_b8.nAlloc) {
        local_b8.zText[(ulong)local_b8.nChar + 2] = ' ';
        (local_b8.zText + local_b8.nChar)[0] = '-';
        (local_b8.zText + local_b8.nChar)[1] = '-';
        local_b8.nChar = local_b8.nChar + 3;
      }
      else {
        enlargeAndAppend(&local_b8,"-- ",3);
      }
      sqlite3_str_append(&local_b8,zRawSql,(int)lVar10);
      cVar6 = zRawSql[lVar10];
      zRawSql = zRawSql + lVar10;
    }
  }
  if (local_b8.accError != '\0') {
    uVar4 = local_b8.printfFlags;
    if ((local_b8._28_2_ & 0x400) != 0) {
      if (local_b8.zText != (char *)0x0) {
        sqlite3DbFreeNN(local_b8.db,local_b8.zText);
      }
      local_b8._28_2_ = CONCAT11(uVar4,local_b8.accError) & 0xfbff;
    }
    local_b8.nAlloc = 0;
    local_b8.nChar = 0;
    local_b8.zText = (char *)0x0;
  }
  pcVar9 = sqlite3StrAccumFinish(&local_b8);
  return pcVar9;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VdbeExpandSql(
  Vdbe *p,                 /* The prepared statement being evaluated */
  const char *zRawSql      /* Raw text of the SQL statement */
){
  sqlite3 *db;             /* The database connection */
  int idx = 0;             /* Index of a host parameter */
  int nextIndex = 1;       /* Index of next ? host parameter */
  int n;                   /* Length of a token prefix */
  int nToken;              /* Length of the parameter token */
  int i;                   /* Loop counter */
  Mem *pVar;               /* Value of a host parameter */
  StrAccum out;            /* Accumulate the output here */
#ifndef SQLITE_OMIT_UTF16
  Mem utf8;                /* Used to convert UTF16 into UTF8 for display */
#endif

  db = p->db;
  sqlite3StrAccumInit(&out, 0, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
  if( db->nVdbeExec>1 ){
    while( *zRawSql ){
      const char *zStart = zRawSql;
      while( *(zRawSql++)!='\n' && *zRawSql );
      sqlite3_str_append(&out, "-- ", 3);
      assert( (zRawSql - zStart) > 0 );
      sqlite3_str_append(&out, zStart, (int)(zRawSql-zStart));
    }
  }else if( p->nVar==0 ){
    sqlite3_str_append(&out, zRawSql, sqlite3Strlen30(zRawSql));
  }else{
    while( zRawSql[0] ){
      n = findNextHostParameter(zRawSql, &nToken);
      assert( n>0 );
      sqlite3_str_append(&out, zRawSql, n);
      zRawSql += n;
      assert( zRawSql[0] || nToken==0 );
      if( nToken==0 ) break;
      if( zRawSql[0]=='?' ){
        if( nToken>1 ){
          assert( sqlite3Isdigit(zRawSql[1]) );
          sqlite3GetInt32(&zRawSql[1], &idx);
        }else{
          idx = nextIndex;
        }
      }else{
        assert( zRawSql[0]==':' || zRawSql[0]=='$' ||
                zRawSql[0]=='@' || zRawSql[0]=='#' );
        testcase( zRawSql[0]==':' );
        testcase( zRawSql[0]=='$' );
        testcase( zRawSql[0]=='@' );
        testcase( zRawSql[0]=='#' );
        idx = sqlite3VdbeParameterIndex(p, zRawSql, nToken);
        assert( idx>0 );
      }
      zRawSql += nToken;
      nextIndex = MAX(idx + 1, nextIndex);
      assert( idx>0 && idx<=p->nVar );
      pVar = &p->aVar[idx-1];
      if( pVar->flags & MEM_Null ){
        sqlite3_str_append(&out, "NULL", 4);
      }else if( pVar->flags & (MEM_Int|MEM_IntReal) ){
        sqlite3_str_appendf(&out, "%lld", pVar->u.i);
      }else if( pVar->flags & MEM_Real ){
        sqlite3_str_appendf(&out, "%!.15g", pVar->u.r);
      }else if( pVar->flags & MEM_Str ){
        int nOut;  /* Number of bytes of the string text to include in output */
#ifndef SQLITE_OMIT_UTF16
        u8 enc = ENC(db);
        if( enc!=SQLITE_UTF8 ){
          memset(&utf8, 0, sizeof(utf8));
          utf8.db = db;
          sqlite3VdbeMemSetStr(&utf8, pVar->z, pVar->n, enc, SQLITE_STATIC);
          if( SQLITE_NOMEM==sqlite3VdbeChangeEncoding(&utf8, SQLITE_UTF8) ){
            out.accError = SQLITE_NOMEM;
            out.nAlloc = 0;
          }
          pVar = &utf8;
        }
#endif
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ){
          nOut = SQLITE_TRACE_SIZE_LIMIT;
          while( nOut<pVar->n && (pVar->z[nOut]&0xc0)==0x80 ){ nOut++; }
        }
#endif
        sqlite3_str_appendf(&out, "'%.*q'", nOut, pVar->z);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
#ifndef SQLITE_OMIT_UTF16
        if( enc!=SQLITE_UTF8 ) sqlite3VdbeMemRelease(&utf8);
#endif
      }else if( pVar->flags & MEM_Zero ){
        sqlite3_str_appendf(&out, "zeroblob(%d)", pVar->u.nZero);
      }else{
        int nOut;  /* Number of bytes of the blob to include in output */
        assert( pVar->flags & MEM_Blob );
        sqlite3_str_append(&out, "x'", 2);
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ) nOut = SQLITE_TRACE_SIZE_LIMIT;
#endif
        for(i=0; i<nOut; i++){
          sqlite3_str_appendf(&out, "%02x", pVar->z[i]&0xff);
        }
        sqlite3_str_append(&out, "'", 1);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
      }
    }
  }
  if( out.accError ) sqlite3_str_reset(&out);
  return sqlite3StrAccumFinish(&out);
}